

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.hpp
# Opt level: O0

void __thiscall
actorpp::detail::ChannelImpl<actorpp::CloseReason>::ChannelImpl
          (ChannelImpl<actorpp::CloseReason> *this,
          shared_ptr<actorpp::detail::ActorImpl> *actor_impl)

{
  shared_ptr<actorpp::detail::ActorImpl> *actor_impl_local;
  ChannelImpl<actorpp::CloseReason> *this_local;
  
  std::shared_ptr<actorpp::detail::ActorImpl>::shared_ptr(&this->actor_impl,actor_impl);
  std::
  queue<actorpp::CloseReason,std::deque<actorpp::CloseReason,std::allocator<actorpp::CloseReason>>>
  ::queue<std::deque<actorpp::CloseReason,std::allocator<actorpp::CloseReason>>,void>
            ((queue<actorpp::CloseReason,std::deque<actorpp::CloseReason,std::allocator<actorpp::CloseReason>>>
              *)&this->elements);
  return;
}

Assistant:

ChannelImpl(std::shared_ptr<ActorImpl> actor_impl)
      : actor_impl(std::move(actor_impl)) {}